

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::TextureCubeShadowCase::iterate(TextureCubeShadowCase *this)

{
  Vec2 *vec;
  Vec2 *vec_00;
  TestLog *log;
  RenderContext *context;
  pointer pFVar1;
  pointer pFVar2;
  int y;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  CompareMode CVar7;
  CubeFace CVar8;
  undefined4 extraout_var;
  RenderTarget *pRVar10;
  NotSupportedError *this_00;
  char *description;
  qpTestResult testResult;
  TestContext *pTVar11;
  allocator<char> local_341;
  pointer local_340;
  CubeFace local_338;
  RandomViewport viewport;
  LodPrecision lodPrecision;
  vector<float,_std::allocator<float>_> texCoord;
  int *local_2f0;
  ScopedLogSection iterSection;
  Surface result;
  undefined1 local_2b8 [32];
  int local_298;
  PixelFormat pixelFormat;
  undefined1 local_248 [76];
  _func_int **pp_Stack_1fc;
  size_type local_1f4;
  bool bStack_1ec;
  undefined3 uStack_1eb;
  CompareMode CStack_1e8;
  int local_1e4;
  anon_union_16_3_1194ccdc_for_v local_1e0;
  bool local_1d0;
  undefined7 uStack_1cf;
  LodMode local_1c8;
  undefined1 local_1b0 [8];
  _func_int **pp_Stack_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  int local_190;
  anon_union_16_3_1194ccdc_for_v local_18c [21];
  long lVar9;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  dVar5 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  dVar6 = ::deInt32Hash(this->m_caseNdx);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,pRVar10,0x1c,0x1c,dVar5 ^ dVar6);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_248,"Test",(allocator<char> *)&lodPrecision);
  de::toString<int>((string *)local_2b8,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&texCoord,"Test ",&local_341);
  de::toString<int>((string *)&pixelFormat,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texCoord,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixelFormat);
  tcu::ScopedLogSection::ScopedLogSection(&iterSection,log,(string *)local_1b0,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&pixelFormat);
  std::__cxx11::string::~string((string *)&texCoord);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)local_2b8);
  std::__cxx11::string::~string((string *)local_248);
  local_340 = (this->m_cases).
              super__Vector_base<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_caseNdx;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_248,TEXTURETYPE_CUBE);
  if ((viewport.width < 0x1c) || (viewport.height < 0x1c)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Too small render target",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureShadowTests.cpp"
               ,0x25f);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar9 + 0xb8))(0x8513,local_340->texture->m_glTexture);
  (**(code **)(lVar9 + 0x1360))(0x8513,0x2801,this->m_minFilter);
  (**(code **)(lVar9 + 0x1360))(0x8513,0x2800,this->m_magFilter);
  (**(code **)(lVar9 + 0x1360))(0x8513,0x2802,this->m_wrapS);
  (**(code **)(lVar9 + 0x1360))(0x8513,0x2803,this->m_wrapT);
  (**(code **)(lVar9 + 0x1360))(0x8513,0x884c,0x884e);
  (**(code **)(lVar9 + 0x1360))(0x8513,0x884d,this->m_compareFunc);
  (**(code **)(lVar9 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  glu::mapGLSampler((Sampler *)local_1b0,0x812f,0x812f,this->m_minFilter,this->m_magFilter);
  local_1e4 = local_190;
  local_1f4 = local_1a0._M_allocated_capacity;
  bStack_1ec = (bool)local_1a0._M_local_buf[8];
  uStack_1eb = local_1a0._9_3_;
  CStack_1e8 = local_1a0._12_4_;
  local_248._68_8_ = local_1b0;
  pp_Stack_1fc = pp_Stack_1a8;
  local_1e0._0_8_ = local_18c[0]._0_8_;
  local_1e0._8_8_ = local_18c[0]._8_8_;
  uStack_1cf = (undefined7)((ulong)local_18c[1]._0_8_ >> 8);
  local_1d0 = true;
  CVar7 = glu::mapGLCompareFunc(this->m_compareFunc);
  CStack_1e8 = CVar7;
  local_248._4_4_ = SAMPLERTYPE_SHADOW;
  local_1c8 = LODMODE_EXACT;
  local_248._32_4_ = local_340->ref;
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
  std::operator<<((ostream *)&pp_Stack_1a8,"Compare reference value =  ");
  std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,(float)local_248._32_4_);
  std::operator<<((ostream *)&pp_Stack_1a8,"\n");
  std::operator<<((ostream *)&pp_Stack_1a8,"Coordinates: ");
  vec = &local_340->bottomLeft;
  tcu::operator<<((ostream *)&pp_Stack_1a8,vec);
  std::operator<<((ostream *)&pp_Stack_1a8," -> ");
  vec_00 = &local_340->topRight;
  tcu::operator<<((ostream *)&pp_Stack_1a8,vec_00);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
  CVar8 = CUBEFACE_NEGATIVE_X;
  local_2f0 = &DAT_01848328;
  do {
    if (CVar8 == CUBEFACE_LAST) {
      iVar4 = this->m_caseNdx + 1;
      this->m_caseNdx = iVar4;
      pFVar1 = (this->m_cases).
               super__Vector_base<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pFVar2 = (this->m_cases).
               super__Vector_base<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
               ._M_impl.super__Vector_impl_data._M_start;
      tcu::ScopedLogSection::~ScopedLogSection(&iterSection);
      return (IterateResult)(iVar4 < (int)((ulong)((long)pFVar1 - (long)pFVar2) >> 5));
    }
    local_338 = CVar8;
    tcu::Surface::Surface(&result,viewport.width,viewport.height);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    glu::TextureTestUtil::computeQuadTexCoordCube(&texCoord,local_338,vec,vec_00);
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
    std::operator<<((ostream *)&pp_Stack_1a8,"Face ");
    std::operator<<((ostream *)&pp_Stack_1a8,(char *)((long)&DAT_01848328 + (long)*local_2f0));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_248);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureShadowTests.cpp"
                    ,0x288);
    y = viewport.y;
    iVar4 = viewport.x;
    context = ((this->super_TestCase).m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&result);
    glu::readPixels(context,iVar4,y,(PixelBufferAccess *)local_1b0);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureShadowTests.cpp"
                    ,0x28b);
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    pixelFormat.redBits = (pRVar10->m_pixelFormat).redBits;
    pixelFormat.greenBits = (pRVar10->m_pixelFormat).greenBits;
    pixelFormat.blueBits = (pRVar10->m_pixelFormat).blueBits;
    pixelFormat.alphaBits = (pRVar10->m_pixelFormat).alphaBits;
    lodPrecision.rule = RULE_OPENGL;
    lodPrecision.derivateBits = 0x16;
    lodPrecision.lodBits = 0x10;
    tcu::TexComparePrecision::TexComparePrecision((TexComparePrecision *)local_2b8);
    lodPrecision.derivateBits = 10;
    lodPrecision.lodBits = 5;
    local_2b8._0_8_ = (pointer)0xa0000000a;
    local_2b8._8_4_ = 10;
    local_2b8._12_4_ = 6;
    local_2b8._16_4_ = 6;
    local_2b8._20_4_ = 0;
    local_2b8._24_4_ = 5;
    local_2b8._28_4_ = 0x10;
    local_298 = pixelFormat.redBits + -1;
    pTVar11 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&result);
    bVar3 = verifyTexCompareResult<tcu::TextureCube>
                      (pTVar11,(ConstPixelBufferAccess *)local_1b0,&local_340->texture->m_refTexture
                       ,texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,(ReferenceParams *)local_248,
                       (TexComparePrecision *)local_2b8,&lodPrecision,&pixelFormat);
    if (!bVar3) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
      std::operator<<((ostream *)&pp_Stack_1a8,
                      "Warning: Verification assuming high-quality PCF filtering failed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
      lodPrecision.lodBits = 4;
      local_2b8._12_4_ = 4;
      local_2b8._16_4_ = 4;
      local_2b8._20_4_ = 0;
      local_2b8._24_4_ = 0;
      pTVar11 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&result);
      bVar3 = verifyTexCompareResult<tcu::TextureCube>
                        (pTVar11,(ConstPixelBufferAccess *)local_1b0,
                         &local_340->texture->m_refTexture,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,(ReferenceParams *)local_248,
                         (TexComparePrecision *)local_2b8,&lodPrecision,&pixelFormat);
      if (bVar3) {
        pTVar11 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        testResult = QP_TEST_RESULT_QUALITY_WARNING;
        description = "Low-quality result";
        if (pTVar11->m_testResult != QP_TEST_RESULT_PASS) goto LAB_0101ef52;
      }
      else {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
        std::operator<<((ostream *)&pp_Stack_1a8,
                        "ERROR: Verification against low precision requirements failed, failing test case."
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
        pTVar11 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        testResult = QP_TEST_RESULT_FAIL;
        description = "Image verification failed";
      }
      tcu::TestContext::setTestResult(pTVar11,testResult,description);
    }
LAB_0101ef52:
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
    tcu::Surface::~Surface(&result);
    CVar8 = local_338 + CUBEFACE_POSITIVE_X;
    local_2f0 = local_2f0 + 1;
  } while( true );
}

Assistant:

TextureCubeShadowCase::IterateResult TextureCubeShadowCase::iterate (void)
{
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	const int						viewportSize	= 28;
	const RandomViewport			viewport		(m_context.getRenderTarget(), viewportSize, viewportSize, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const tcu::ScopedLogSection		iterSection		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	const FilterCase&				curCase			= m_cases[m_caseNdx];
	ReferenceParams					sampleParams	(TEXTURETYPE_CUBE);

	if (viewport.width < viewportSize || viewport.height < viewportSize)
		throw tcu::NotSupportedError("Too small render target", DE_NULL, __FILE__, __LINE__);

	// Setup texture
	gl.bindTexture	(GL_TEXTURE_CUBE_MAP, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_COMPARE_MODE,	GL_COMPARE_REF_TO_TEXTURE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_COMPARE_FUNC,	m_compareFunc);

	// Other state
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Params for reference computation.
	sampleParams.sampler					= glu::mapGLSampler(GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE, m_minFilter, m_magFilter);
	sampleParams.sampler.seamlessCubeMap	= true;
	sampleParams.sampler.compare			= glu::mapGLCompareFunc(m_compareFunc);
	sampleParams.samplerType				= SAMPLERTYPE_SHADOW;
	sampleParams.lodMode					= LODMODE_EXACT;
	sampleParams.ref						= curCase.ref;

	m_testCtx.getLog()
		<< TestLog::Message
		<< "Compare reference value =  " << sampleParams.ref << "\n"
		<< "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight
		<< TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(viewport.width, viewport.height);
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		m_testCtx.getLog() << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, result.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

		{
			const tcu::PixelFormat		pixelFormat		= m_context.getRenderTarget().getPixelFormat();
			tcu::LodPrecision			lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
			tcu::TexComparePrecision	texComparePrecision;

			lodPrecision.derivateBits			= 10;
			lodPrecision.lodBits				= 5;
			texComparePrecision.coordBits		= tcu::IVec3(10,10,10);
			texComparePrecision.uvwBits			= tcu::IVec3(6,6,0);
			texComparePrecision.pcfBits			= 5;
			texComparePrecision.referenceBits	= 16;
			texComparePrecision.resultBits		= pixelFormat.redBits-1;

			const bool isHighQuality = verifyTexCompareResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
															  &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				m_testCtx.getLog() << TestLog::Message << "Warning: Verification assuming high-quality PCF filtering failed." << TestLog::EndMessage;

				lodPrecision.lodBits			= 4;
				texComparePrecision.uvwBits		= tcu::IVec3(4,4,0);
				texComparePrecision.pcfBits		= 0;

				const bool isOk = verifyTexCompareResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
														 &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				}
				else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality result");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}